

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

upb_MessageValue
upb_Message_GetField(upb_Message *msg,upb_MiniTableField *field,upb_MessageValue default_val)

{
  _Bool _Var1;
  upb_Extension *puVar2;
  upb_MessageValue *from;
  upb_MessageValue ret;
  upb_MessageValue local_30;
  upb_MessageValue local_20;
  
  local_20.str_val.size = default_val.str_val.size;
  local_20.int64_val = (int64_t)default_val.double_val;
  if ((field->mode_dont_copy_me__upb_internal_use_only & 8) == 0) {
    if (field->presence < 0) {
LAB_002b396d:
      _Var1 = upb_Message_HasBaseField(msg,field);
      if (!_Var1) goto LAB_002b39b7;
    }
    else {
      _Var1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(field,&local_20);
      if (!_Var1) goto LAB_002b396d;
    }
    from = (upb_MessageValue *)
           ((long)&msg->field_0 + (ulong)field->offset_dont_copy_me__upb_internal_use_only);
  }
  else {
    puVar2 = _upb_Message_Getext_dont_copy_me__upb_internal_use_only
                       (msg,(upb_MiniTableExtension *)field);
    if ((field->mode_dont_copy_me__upb_internal_use_only & 8) == 0) {
      __assert_fail("upb_MiniTableField_IsExtension(f)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0x11d,
                    "void _upb_Message_GetExtensionField(const struct upb_Message *, const upb_MiniTableExtension *, const void *, void *)"
                   );
    }
    if (puVar2 != (upb_Extension *)0x0) {
      from = &puVar2->data;
      goto LAB_002b39c4;
    }
LAB_002b39b7:
    from = &local_20;
  }
LAB_002b39c4:
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(field,&local_30,from);
  return local_30;
}

Assistant:

UPB_API_INLINE upb_MessageValue upb_Message_GetField(
    const struct upb_Message* msg, const upb_MiniTableField* field,
    upb_MessageValue default_val) {
  upb_MessageValue ret;
  if (upb_MiniTableField_IsExtension(field)) {
    _upb_Message_GetExtensionField(msg, (upb_MiniTableExtension*)field,
                                   &default_val, &ret);
  } else {
    _upb_Message_GetNonExtensionField(msg, field, &default_val, &ret);
  }
  return ret;
}